

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall
tf::Executor::
_schedule<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
          (Executor *this,
          __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
          first,__normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                last)

{
  ulong uVar1;
  NonblockingNotifierV2 *this_00;
  size_type sVar2;
  ulong __n;
  long in_RDI;
  size_t i;
  size_t num_nodes;
  scoped_lock<std::mutex> lock;
  unsigned_long b;
  mutex_type *in_stack_ffffffffffffff78;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff88;
  NonblockingNotifierV2 *in_stack_ffffffffffffff90;
  ulong local_60;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  local_40;
  reference local_38;
  Node *in_stack_ffffffffffffffd0;
  UnboundedTaskQueue<tf::Node_*> *in_stack_ffffffffffffffd8;
  
  uVar1 = __gnu_cxx::operator-
                    (in_stack_ffffffffffffff80,
                     (__normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                      *)in_stack_ffffffffffffff78);
  if (uVar1 != 0) {
    for (local_60 = 0; local_60 < uVar1; local_60 = local_60 + 1) {
      this_00 = (NonblockingNotifierV2 *)(in_RDI + 0xd8);
      local_38 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                 ::operator[](&local_40,local_60);
      in_stack_ffffffffffffff88 =
           std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::get
                     ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)this_00);
      in_stack_ffffffffffffff90 = this_00;
      sVar2 = std::
              vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
              ::size((vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                      *)this_00);
      __n = (ulong)in_stack_ffffffffffffff88 % sVar2;
      std::
      vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>::
      operator[]((vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                  *)in_stack_ffffffffffffff90,__n);
      std::scoped_lock<std::mutex>::scoped_lock
                ((scoped_lock<std::mutex> *)this_00,in_stack_ffffffffffffff78);
      std::
      vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>::
      operator[]((vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                  *)in_stack_ffffffffffffff90,__n);
      UnboundedTaskQueue<tf::Node_*>::push(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x116d72);
    }
    NonblockingNotifierV2::notify_n(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

inline void Executor::_schedule(I first, I last) {
  
  size_t num_nodes = last - first;

  if(num_nodes == 0) {
    return;
  }

  // NOTE: We cannot use first/last in the for-loop (e.g., for(; first != last; ++first)).
  // This is because when a node v is inserted into the queue, v can run and finish 
  // immediately. If v is the last node in the graph, it will tear down the parent task vector
  // which cause the last ++first to fail. This problem is specific to MSVC which has a stricter
  // iterator implementation in std::vector than GCC/Clang.
  for(size_t i=0; i<num_nodes; i++) {
    _buffers.push(detail::get_node_ptr(first[i]));
  }
  _notifier.notify_n(num_nodes);
}